

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O1

Result wabt::WriteBinaryModule(Stream *stream,Module *module,WriteBinaryOptions *options)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  pointer pRVar5;
  __node_base _Var6;
  pointer pRVar7;
  Result RVar8;
  pointer pRVar9;
  _Hash_node_base *p_Var10;
  _Hash_node_base *p_Var11;
  __node_ptr __tmp;
  BinaryWriter binary_writer;
  BinaryWriter local_1a0;
  
  local_1a0.symtab_.seen_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1a0.symtab_.seen_names_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1a0.symtab_.seen_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1a0.symtab_.seen_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_1a0.symtab_.symbols_.
  super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a0.symtab_.symbols_.
  super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a0.symtab_.symbols_.
  super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a0.symtab_.functions_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a0.symtab_.functions_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a0.symtab_.functions_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a0.symtab_.tables_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a0.symtab_.tables_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a0.symtab_.tables_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a0.symtab_.globals_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a0.symtab_.globals_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a0.symtab_.globals_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a0.symtab_.seen_names_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1a0.reloc_sections_.
  super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a0.reloc_sections_.
  super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a0.reloc_sections_.
  super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_1a0.reloc_sections_.
  super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_1a0.current_reloc_section_._0_4_ = 0;
  local_1a0._196_8_ = 0;
  local_1a0.last_section_offset_ = 0;
  local_1a0.last_section_leb_size_guess_ = 0;
  local_1a0.last_section_type_ = Invalid;
  local_1a0.code_metadata_sections_._M_h._M_buckets =
       &local_1a0.code_metadata_sections_._M_h._M_single_bucket;
  local_1a0.last_section_payload_offset_ = 0;
  local_1a0.last_subsection_offset_ = 0;
  local_1a0.last_subsection_leb_size_guess_ = 0;
  local_1a0.last_subsection_payload_offset_ = 0;
  local_1a0.code_start_ = 0;
  local_1a0.data_count_start_._0_1_ = 0;
  local_1a0.data_count_start_._1_7_ = 0;
  local_1a0.data_count_end_._0_1_ = 0;
  local_1a0._281_8_ = 0;
  local_1a0.code_metadata_sections_._M_h._M_bucket_count = 1;
  local_1a0.code_metadata_sections_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1a0.code_metadata_sections_._M_h._M_element_count = 0;
  local_1a0.code_metadata_sections_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_1a0.code_metadata_sections_._M_h._M_rehash_policy._M_next_resize = 0;
  local_1a0.code_metadata_sections_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_1a0.stream_ = stream;
  local_1a0.options_ = options;
  local_1a0.module_ = module;
  local_1a0.symtab_.seen_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1a0.symtab_.seen_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  RVar8 = anon_unknown_1::BinaryWriter::WriteModule(&local_1a0);
  _Var6._M_nxt = local_1a0.code_metadata_sections_._M_h._M_before_begin._M_nxt;
  while (_Var6._M_nxt != (_Hash_node_base *)0x0) {
    p_Var1 = (_Var6._M_nxt)->_M_nxt;
    p_Var2 = _Var6._M_nxt[4]._M_nxt;
    for (p_Var10 = _Var6._M_nxt[3]._M_nxt; p_Var10 != p_Var2; p_Var10 = p_Var10 + 4) {
      p_Var3 = p_Var10[2]._M_nxt;
      for (p_Var11 = p_Var10[1]._M_nxt; p_Var11 != p_Var3; p_Var11 = p_Var11 + 4) {
        p_Var4 = p_Var11[1]._M_nxt;
        if (p_Var4 != (_Hash_node_base *)0x0) {
          operator_delete(p_Var4,(long)p_Var11[3]._M_nxt - (long)p_Var4);
        }
      }
      p_Var11 = p_Var10[1]._M_nxt;
      if (p_Var11 != (_Hash_node_base *)0x0) {
        operator_delete(p_Var11,(long)p_Var10[3]._M_nxt - (long)p_Var11);
      }
    }
    p_Var10 = _Var6._M_nxt[3]._M_nxt;
    if (p_Var10 != (_Hash_node_base *)0x0) {
      operator_delete(p_Var10,(long)_Var6._M_nxt[5]._M_nxt - (long)p_Var10);
    }
    operator_delete(_Var6._M_nxt,0x38);
    _Var6._M_nxt = p_Var1;
  }
  memset(local_1a0.code_metadata_sections_._M_h._M_buckets,0,
         local_1a0.code_metadata_sections_._M_h._M_bucket_count << 3);
  local_1a0.code_metadata_sections_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1a0.code_metadata_sections_._M_h._M_element_count = 0;
  pRVar9 = local_1a0.reloc_sections_.
           super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar7 = local_1a0.reloc_sections_.
           super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (&local_1a0.code_metadata_sections_._M_h._M_single_bucket !=
      local_1a0.code_metadata_sections_._M_h._M_buckets) {
    operator_delete(local_1a0.code_metadata_sections_._M_h._M_buckets,
                    local_1a0.code_metadata_sections_._M_h._M_bucket_count << 3);
    pRVar9 = local_1a0.reloc_sections_.
             super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pRVar7 = local_1a0.reloc_sections_.
             super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; pRVar9 != pRVar7; pRVar9 = pRVar9 + 1) {
    pRVar5 = (pRVar9->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pRVar5 != (pointer)0x0) {
      operator_delete(pRVar5,(long)(pRVar9->relocations).
                                   super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pRVar5)
      ;
    }
  }
  if (local_1a0.reloc_sections_.
      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.reloc_sections_.
                    super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    CONCAT44(local_1a0.reloc_sections_.
                             super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_1a0.reloc_sections_.
                             super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_1a0.reloc_sections_.
                          super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::_M_erase(&local_1a0.symtab_.seen_names_._M_t,
             (_Link_type)
             local_1a0.symtab_.seen_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  if (local_1a0.symtab_.globals_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.symtab_.globals_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1a0.symtab_.globals_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a0.symtab_.globals_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1a0.symtab_.tables_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.symtab_.tables_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1a0.symtab_.tables_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a0.symtab_.tables_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1a0.symtab_.functions_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.symtab_.functions_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1a0.symtab_.functions_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a0.symtab_.functions_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1a0.symtab_.symbols_.
      super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.symtab_.symbols_.
                    super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a0.symtab_.symbols_.
                          super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a0.symtab_.symbols_.
                          super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (Result)RVar8.enum_;
}

Assistant:

void BinaryWriter::WriteTableNumberWithReloc(Index value, const char* desc) {
  // Unless reference types are enabled, all references to tables refer to table
  // 0, so no relocs need be emitted when making relocatable binaries.
  if (options_.relocatable && options_.features.reference_types_enabled()) {
    AddReloc(RelocType::TableNumberLEB, value);
    WriteFixedS32Leb128(stream_, value, desc);
  } else {
    WriteS32Leb128(stream_, value, desc);
  }
}